

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-validator.cpp
# Opt level: O0

void __thiscall
wasm::ValidationInfo::shouldBeIntOrUnreachable
          (ValidationInfo *this,Type ty,Expression *curr,char *text,Function *func)

{
  BasicType BVar1;
  Function *func_local;
  char *text_local;
  Expression *curr_local;
  ValidationInfo *this_local;
  Type ty_local;
  
  this_local = (ValidationInfo *)ty.id;
  BVar1 = wasm::Type::getBasic((Type *)&this_local);
  if (2 < BVar1 - unreachable) {
    fail<wasm::Expression*,char_const*>(this,text,curr,func);
  }
  return;
}

Assistant:

void shouldBeIntOrUnreachable(Type ty,
                                Expression* curr,
                                const char* text,
                                Function* func = nullptr) {
    switch (ty.getBasic()) {
      case Type::i32:
      case Type::i64:
      case Type::unreachable: {
        break;
      }
      default:
        fail(text, curr, func);
    }
  }